

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTableCopy(SharedValidator *this,Location *loc,Var *dst_var,Var *src_var)

{
  Result RVar1;
  Var local_118;
  Enum local_cc;
  Var local_c8;
  Enum local_7c;
  undefined1 local_78 [8];
  TableType src_table;
  TableType dst_table;
  Var *src_var_local;
  Var *dst_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&dst_table.limits.field_0x14,TableCopy);
  this_local._4_4_ = CheckInstr(this,(Opcode)dst_table.limits._20_4_,loc);
  TableType::TableType((TableType *)&src_table.limits.has_max);
  TableType::TableType((TableType *)local_78);
  Var::Var(&local_c8,dst_var);
  local_7c = (Enum)CheckTableIndex(this,&local_c8,(TableType *)&src_table.limits.has_max);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_7c);
  Var::~Var(&local_c8);
  Var::Var(&local_118,src_var);
  local_cc = (Enum)CheckTableIndex(this,&local_118,(TableType *)local_78);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_cc);
  Var::~Var(&local_118);
  RVar1 = TypeChecker::OnTableCopy(&this->typechecker_);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = CheckType(this,loc,(Type)local_78,(Type)src_table.limits._16_8_,"table.copy");
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTableCopy(const Location& loc,
                                    Var dst_var,
                                    Var src_var) {
  Result result = CheckInstr(Opcode::TableCopy, loc);
  TableType dst_table;
  TableType src_table;
  result |= CheckTableIndex(dst_var, &dst_table);
  result |= CheckTableIndex(src_var, &src_table);
  result |= typechecker_.OnTableCopy();
  result |= CheckType(loc, src_table.element, dst_table.element, "table.copy");
  return result;
}